

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
ft::
map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::erase(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,iterator *first,iterator *last)

{
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar1;
  RBTree<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pRVar2;
  iterator local_48;
  
  while (ptVar1 = first->m_node, ptVar1 != last->m_node) {
    pRVar2 = first->m_tree;
    treeIterator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(first);
    local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113b70;
    local_48.m_tree = pRVar2;
    local_48.m_node = ptVar1;
    erase(this,&local_48);
  }
  return;
}

Assistant:

void	erase(iterator first, iterator last)
	{
		while (first != last)
		{
			iterator	tmp(first);
			++first;
			this->erase(tmp);
		}
	}